

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall tetgenio::load_plc(tetgenio *this,char *filebasename,int object)

{
  undefined1 local_1d;
  bool success;
  int object_local;
  char *filebasename_local;
  tetgenio *this_local;
  
  if (object == 0) {
    local_1d = load_node(this,filebasename);
  }
  else if (object == 1) {
    local_1d = load_poly(this,filebasename);
  }
  else if (object == 2) {
    local_1d = load_off(this,filebasename);
  }
  else if (object == 3) {
    local_1d = load_ply(this,filebasename);
  }
  else if (object == 4) {
    local_1d = load_stl(this,filebasename);
  }
  else if (object == 5) {
    local_1d = load_medit(this,filebasename,0);
  }
  else if (object == 6) {
    local_1d = load_vtk(this,filebasename);
  }
  else {
    local_1d = load_poly(this,filebasename);
  }
  if (local_1d != false) {
    load_edge(this,filebasename);
    load_var(this,filebasename);
    load_mtr(this,filebasename);
  }
  return local_1d;
}

Assistant:

bool tetgenio::load_plc(char* filebasename, int object)
{
  bool success;

  if (object == (int) tetgenbehavior::NODES) {
    success = load_node(filebasename);
  } else if (object == (int) tetgenbehavior::POLY) {
    success = load_poly(filebasename);
  } else if (object == (int) tetgenbehavior::OFF) {
    success = load_off(filebasename);
  } else if (object == (int) tetgenbehavior::PLY) {
    success = load_ply(filebasename);
  } else if (object == (int) tetgenbehavior::STL) {
    success = load_stl(filebasename);
  } else if (object == (int) tetgenbehavior::MEDIT) {
    success = load_medit(filebasename, 0);
  } else if (object == (int) tetgenbehavior::VTK) {
    success = load_vtk(filebasename);
  } else {
    success = load_poly(filebasename);
  }

  if (success) {
    // Try to load the following files (.edge, .var, .mtr).
    load_edge(filebasename);
    load_var(filebasename);
    load_mtr(filebasename);
  }

  return success;
}